

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Minisat::
OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
::smudge(OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
         *this,Lit *idx)

{
  char *pcVar1;
  Lit *idx_local;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Solver::Watcher,_int>,_Minisat::Solver::WatcherDeleted,_Minisat::MkIndexLit>
  *this_local;
  
  pcVar1 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[](&this->dirty,(Lit)idx->x);
  if (*pcVar1 == '\0') {
    pcVar1 = IntMap<Minisat::Lit,_char,_Minisat::MkIndexLit>::operator[](&this->dirty,(Lit)idx->x);
    *pcVar1 = '\x01';
    vec<Minisat::Lit,_int>::push(&this->dirties,idx);
  }
  return;
}

Assistant:

void  smudge    (const K& idx){
        if (dirty[idx] == 0){
            dirty[idx] = 1;
            dirties.push(idx);
        }
    }